

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreIncTestInt8(void)

{
  char t;
  bool expected;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 2; lVar2 != 0x1d; lVar2 = lVar2 + 3) {
    t = (&UNK_00159b2e)[lVar2];
    si.m_int = t;
    pSVar1 = SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++(&si);
    expected = (bool)(&inc_int8)[lVar2];
    if ((pSVar1->m_int == (&UNK_00159b2f)[lVar2]) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case inc_int8 throw (1): ",&local_51);
      err_msg<signed_char>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreIncTestInt8()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int8_t > si(inc_int8[i].x);
			SafeInt< std::int8_t > vv = ++si;

			if(vv != inc_int8[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int8[i].fExpected )
		{
			err_msg( "Error in case inc_int8 throw (1): ", inc_int8[i].x, inc_int8[i].fExpected );
		}
	}
}